

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dtt_ManProcessVisited(Dtt_Man_t *p)

{
  int iVar1;
  int local_14;
  int Class;
  int i;
  Dtt_Man_t *p_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vVisited);
    if (iVar1 <= local_14) {
      Vec_IntClear(p->vVisited);
      return;
    }
    iVar1 = Vec_IntEntry(p->vVisited,local_14);
    if (p->pVisited[iVar1] == '\0') break;
    p->pVisited[iVar1] = '\0';
    p->pTimes[iVar1] = p->pTimes[iVar1] + 1;
    local_14 = local_14 + 1;
  }
  __assert_fail("p->pVisited[Class]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                ,0x188,"void Dtt_ManProcessVisited(Dtt_Man_t *)");
}

Assistant:

void Dtt_ManProcessVisited( Dtt_Man_t * p )
{
    int i, Class;
    Vec_IntForEachEntry( p->vVisited, Class, i )
    {
        assert( p->pVisited[Class] );
        p->pVisited[Class] = 0;
        p->pTimes[Class]++;
    }
    Vec_IntClear( p->vVisited );
}